

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_maxVecScalar_uvec4(ShaderEvalContext *c)

{
  float fVar1;
  int i;
  uint uVar2;
  long lVar3;
  int i_1;
  uint uVar4;
  undefined8 local_48;
  float local_40;
  float local_3c;
  Vector<unsigned_int,_4> res;
  Vector<unsigned_int,_4> res_1;
  Vector<float,_4> res_2;
  
  local_48 = *(undefined8 *)(c->in[0].m_data + 1);
  local_40 = c->in[0].m_data[3];
  local_3c = c->in[0].m_data[0];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar3 = 0;
  do {
    res.m_data[lVar3] = (uint)(long)*(float *)((long)&local_48 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  fVar1 = c->in[1].m_data[0];
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  res_1.m_data[2] = 0;
  res_1.m_data[3] = 0;
  lVar3 = 0;
  do {
    uVar2 = (uint)(long)fVar1;
    uVar4 = res.m_data[lVar3];
    if (res.m_data[lVar3] <= uVar2) {
      uVar4 = uVar2;
    }
    res_1.m_data[lVar3] = uVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  res_2.m_data[3] = 0.0;
  lVar3 = 0;
  do {
    res_2.m_data[lVar3] = (float)res_1.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  *(undefined8 *)(c->color).m_data = res_2.m_data._0_8_;
  *(undefined8 *)((c->color).m_data + 2) = res_2.m_data._8_8_;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }